

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O3

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_EqString_Test<char>::Body
          (iu_StrTest_x_iutest_x_EqString_Test<char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  AssertionResult iutest_ar;
  String test2;
  String test1;
  type **in_stack_fffffffffffffc38;
  AssertionResult local_3c0;
  AssertionHelper local_398;
  long *local_368;
  long local_360;
  long local_358 [2];
  long *local_348;
  long local_340;
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  long *local_2e8 [2];
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [392];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,(char *)text<char>::test,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,(char *)text<char>::test,(allocator<char> *)local_1a8);
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,local_348,local_340 + (long)local_348);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            (&local_3c0,(internal *)"test1","TestFixture::Text::test",(char *)local_1c8,
             text<char>::test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc38);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x76;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  paVar1 = &local_3c0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,local_348,local_340 + (long)local_348);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
            (&local_3c0,(internal *)"test1","test2",(char *)local_1e8,&local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x77;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = text<char>::test;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_3c0,(internal *)"TestFixture::Text::test","test2",(char *)pbVar2,
             (char *)local_228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x78;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,local_348,local_340 + (long)local_348);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            (&local_3c0,(internal *)"test1","TestFixture::Text::test",(char *)local_248,
             text<char>::test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc38);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x7a;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_268,local_348,local_340 + (long)local_348);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
            (&local_3c0,(internal *)"test1","test2",(char *)local_268,&local_288,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x7b;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = text<char>::test;
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_3c0,(internal *)"TestFixture::Text::test","test2",(char *)pbVar2,
             (char *)local_2a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x7c;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c8,local_348,local_340 + (long)local_348);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            (&local_3c0,(internal *)"test1","TestFixture::Text::test",(char *)local_2c8,
             text<char>::test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc38);
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x7e;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      local_3c0.m_message.field_2._M_allocated_capacity + 1);
    }
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,local_348,local_340 + (long)local_348);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_368,local_360 + (long)local_368);
    iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
              (&local_3c0,(internal *)"test1","test2",(char *)local_2e8,&local_308,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if (local_2e8[0] != local_2d8) {
      operator_delete(local_2e8[0],local_2d8[0] + 1);
    }
    if (local_3c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc3f);
      local_398.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_398.m_part_result.super_iuCodeMessage.m_line = 0x7f;
      local_398.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0.m_message._M_dataplus._M_p,
                        local_3c0.m_message.field_2._M_allocated_capacity + 1);
      }
      pbVar2 = text<char>::test;
      local_328[0] = local_318;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_328,local_368,local_360 + (long)local_368);
      iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                (&local_3c0,(internal *)"TestFixture::Text::test","test2",(char *)pbVar2,
                 (char *)local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
      if (local_328[0] != local_318) {
        operator_delete(local_328[0],local_318[0] + 1);
      }
      if (local_3c0.m_result != false) goto LAB_002d0868;
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc3f);
      local_398.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_398.m_part_result.super_iuCodeMessage.m_line = 0x80;
      local_398.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
LAB_002d0868:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != local_358) {
    operator_delete(local_368,local_358[0] + 1);
  }
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, EqString)
{
    typename TestFixture::String test1 = TestFixture::Text::test;
    typename TestFixture::String test2 = TestFixture::Text::test;
    IUTEST_INFORM_STREQ(test1, TestFixture::Text::test);
    IUTEST_INFORM_STREQ(test1, test2);
    IUTEST_INFORM_STREQ(TestFixture::Text::test, test2);

    IUTEST_EXPECT_STREQ(test1, TestFixture::Text::test);
    IUTEST_EXPECT_STREQ(test1, test2);
    IUTEST_EXPECT_STREQ(TestFixture::Text::test, test2);

    IUTEST_ASSERT_STREQ(test1, TestFixture::Text::test);
    IUTEST_ASSERT_STREQ(test1, test2);
    IUTEST_ASSERT_STREQ(TestFixture::Text::test, test2);
}